

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLTokenizer.hpp
# Opt level: O1

HLSLTokenInfo *
Diligent::Parsing::HLSLTokenInfo::Create
          (HLSLTokenInfo *__return_storage_ptr__,TokenType _Type,const_iterator *DelimStart,
          const_iterator *DelimEnd,const_iterator *LiteralStart,const_iterator *LiteralEnd,
          size_t Idx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_68,LiteralStart->_M_current,LiteralEnd->_M_current);
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_48,DelimStart->_M_current,DelimEnd->_M_current);
  __return_storage_ptr__->Type = _Type;
  paVar1 = &(__return_storage_ptr__->Literal).field_2;
  (__return_storage_ptr__->Literal)._M_dataplus._M_p = (pointer)paVar1;
  if (local_68 == &local_58) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_57,local_58);
    *(undefined8 *)((long)&(__return_storage_ptr__->Literal).field_2 + 8) = uStack_50;
  }
  else {
    (__return_storage_ptr__->Literal)._M_dataplus._M_p = local_68;
    (__return_storage_ptr__->Literal).field_2._M_allocated_capacity = CONCAT71(uStack_57,local_58);
  }
  (__return_storage_ptr__->Literal)._M_string_length = local_60;
  paVar1 = &(__return_storage_ptr__->Delimiter).field_2;
  (__return_storage_ptr__->Delimiter)._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == &local_38) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
    *(undefined8 *)((long)&(__return_storage_ptr__->Delimiter).field_2 + 8) = uStack_30;
  }
  else {
    (__return_storage_ptr__->Delimiter)._M_dataplus._M_p = local_48;
    (__return_storage_ptr__->Delimiter).field_2._M_allocated_capacity = CONCAT71(uStack_37,local_38)
    ;
  }
  (__return_storage_ptr__->Delimiter)._M_string_length = local_40;
  __return_storage_ptr__->Idx = Idx;
  return __return_storage_ptr__;
}

Assistant:

static HLSLTokenInfo Create(TokenType                          _Type,
                                const std::string::const_iterator& DelimStart,
                                const std::string::const_iterator& DelimEnd,
                                const std::string::const_iterator& LiteralStart,
                                const std::string::const_iterator& LiteralEnd,
                                size_t                             Idx)
    {
        return HLSLTokenInfo{_Type, std::string{LiteralStart, LiteralEnd}, std::string{DelimStart, DelimEnd}, Idx};
    }